

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<std::pair<toml::local_date,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_local_date_abi_cxx11_
          (result<std::pair<toml::local_date,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  undefined1 *puVar3;
  const_iterator rollback;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  value_type *pvVar13;
  internal_error *piVar14;
  syntax_error *this_00;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> last;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_03;
  result<toml::detail::region,_toml::detail::none_t> d;
  result<toml::detail::region,_toml::detail::none_t> m;
  result<toml::detail::region,_toml::detail::none_t> y;
  result<toml::detail::region,_toml::detail::none_t> token;
  allocator_type local_369;
  undefined1 local_368 [32];
  undefined1 local_348 [32];
  undefined1 local_328 [8];
  undefined1 local_320 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  _Alloc_hider local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258;
  location local_248;
  undefined1 local_1f8 [80];
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [4];
  string local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  undefined1 local_130 [72];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  bool local_d0 [8];
  region local_c8;
  result<toml::detail::region,_toml::detail::none_t> local_80;
  
  rollback._M_current = *(char **)(this + 0x40);
  sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<4UL>_>,_toml::detail::character<'-'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<'-'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>_>
  ::invoke(&local_80,(location *)this);
  if (local_80.is_ok_ == true) {
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,*(long *)(this + 0x20),
               *(long *)(this + 0x28) + *(long *)(this + 0x20));
    pvVar13 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_80);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              ((string *)local_328,(detail *)(pvVar13->first_)._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (pvVar13->last_)._M_current,in_RCX);
    location::location(&local_248,&local_158,(string *)local_328);
    puVar3 = local_320 + 8;
    if ((undefined1 *)CONCAT44(local_328._4_4_,local_328._0_4_) != puVar3) {
      operator_delete((undefined1 *)CONCAT44(local_328._4_4_,local_328._0_4_),local_320._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    }
    repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<4UL>_>::invoke
              ((result<toml::detail::region,_toml::detail::none_t> *)local_d0,&local_248);
    if (((local_d0[0] != true) ||
        (local_248.iter_._M_current ==
         ((local_248.source_.
           super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
         ._M_finish)) || (*local_248.iter_._M_current != '-')) {
      piVar14 = (internal_error *)__cxa_allocate_exception(0x78);
      local_1f8._0_8_ = local_1f8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1f8,"toml::parse_local_date: invalid year format","");
      source_location::source_location((source_location *)&local_138,&local_248);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[14],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_328,(source_location *)&local_138,(char (*) [14])"should be `-`");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_328;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_348,__l_00,(allocator_type *)&local_2b8);
      local_368._0_8_ = (pointer)0x0;
      local_368._8_8_ = (pointer)0x0;
      local_368._16_8_ = (pointer)0x0;
      format_underline((string *)local_298,(string *)local_1f8,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_348,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_368,false);
      source_location::source_location((source_location *)local_1a8,&local_248);
      internal_error::internal_error(piVar14,(string *)local_298,(source_location *)local_1a8);
      __cxa_throw(piVar14,&internal_error::typeinfo,internal_error::~internal_error);
    }
    local_248.iter_._M_current = local_248.iter_._M_current + 1;
    repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>::invoke
              ((result<toml::detail::region,_toml::detail::none_t> *)&local_138,&local_248);
    if (((local_138._0_1_ != true) ||
        (local_248.iter_._M_current ==
         ((local_248.source_.
           super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
         ._M_finish)) || (*local_248.iter_._M_current != '-')) {
      piVar14 = (internal_error *)__cxa_allocate_exception(0x78);
      local_348._0_8_ = local_348 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_348,"toml::parse_local_date: invalid month format","");
      source_location::source_location((source_location *)local_1a8,&local_248);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[14],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_328,(source_location *)local_1a8,(char (*) [14])"should be `-`");
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)local_328;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_368,__l_01,(allocator_type *)&local_e8);
      local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline((string *)local_1f8,(string *)local_348,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_368,&local_2b8,false);
      source_location::source_location((source_location *)local_298,&local_248);
      internal_error::internal_error(piVar14,(string *)local_1f8,(source_location *)local_298);
      __cxa_throw(piVar14,&internal_error::typeinfo,internal_error::~internal_error);
    }
    local_248.iter_._M_current = local_248.iter_._M_current + 1;
    last._M_current =
         (char *)local_248.source_.
                 super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
    repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>::invoke
              ((result<toml::detail::region,_toml::detail::none_t> *)local_1a8,&local_248);
    if (local_1a8[0] == false) {
      piVar14 = (internal_error *)__cxa_allocate_exception(0x78);
      local_368._0_8_ = local_368 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_368,"toml::parse_local_date: invalid day format","");
      source_location::source_location((source_location *)local_298,&local_248);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[5],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_328,(source_location *)local_298,(char (*) [5])0x187401);
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)local_328;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_2b8,__l_02,&local_369);
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline((string *)local_348,(string *)local_368,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_2b8,&local_e8,false);
      source_location::source_location((source_location *)local_1f8,&local_248);
      internal_error::internal_error(piVar14,(string *)local_348,(source_location *)local_1f8);
      __cxa_throw(piVar14,&internal_error::typeinfo,internal_error::~internal_error);
    }
    pvVar13 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                        ((result<toml::detail::region,_toml::detail::none_t> *)local_d0);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              ((string *)local_328,(detail *)(pvVar13->first_)._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (pvVar13->last_)._M_current,last);
    uVar9 = from_string<int>((string *)local_328,0);
    if ((undefined1 *)CONCAT44(local_328._4_4_,local_328._0_4_) != puVar3) {
      operator_delete((undefined1 *)CONCAT44(local_328._4_4_,local_328._0_4_),local_320._8_8_ + 1);
    }
    pvVar13 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                        ((result<toml::detail::region,_toml::detail::none_t> *)&local_138);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              ((string *)local_328,(detail *)(pvVar13->first_)._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (pvVar13->last_)._M_current,last);
    uVar10 = from_string<int>((string *)local_328,0);
    if ((undefined1 *)CONCAT44(local_328._4_4_,local_328._0_4_) != puVar3) {
      operator_delete((undefined1 *)CONCAT44(local_328._4_4_,local_328._0_4_),local_320._8_8_ + 1);
    }
    pvVar13 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                        ((result<toml::detail::region,_toml::detail::none_t> *)local_1a8);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              ((string *)local_328,(detail *)(pvVar13->first_)._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (pvVar13->last_)._M_current,last);
    iVar11 = from_string<int>((string *)local_328,0);
    if ((undefined1 *)CONCAT44(local_328._4_4_,local_328._0_4_) != puVar3) {
      operator_delete((undefined1 *)CONCAT44(local_328._4_4_,local_328._0_4_),local_320._8_8_ + 1);
    }
    uVar12 = 0x1c;
    if (((uVar9 & 3) == 0) &&
       (uVar12 = 0x1d,
       (ushort)((ushort)((short)uVar9 * 0x5c29 + 0x51cU) >> 2 | (short)uVar9 * 0x4000) < 0x28f)) {
      uVar8 = (ushort)(uVar9 * 0x5c29 + 0x510);
      uVar12 = ((ushort)(uVar8 >> 4 | uVar8 << 0xc) < 0xa3) + 0x1c;
    }
    if ((uVar10 & 0xff) != 2) {
      uVar12 = ((uVar10 & 0xfd) == 9 || (uVar10 & 0xfd) == 4) ^ 0x1f;
    }
    if ((((int)(char)uVar10 - 0xdU < 0xfffffff4) || ((char)iVar11 < 1)) ||
       (uVar12 < (uint)(int)(char)iVar11)) {
      this_00 = (syntax_error *)__cxa_allocate_exception(0x78);
      local_368._0_8_ = local_368 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_368,"toml::parse_date: invalid date: it does not conform RFC3339.",
                 "");
      source_location::source_location((source_location *)local_298,(location *)this);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[78],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_328,(source_location *)local_298,
                 (char (*) [78])
                 "month should be 01-12, day should be 01-28,29,30,31, depending on month/year.");
      __l_03._M_len = 1;
      __l_03._M_array = (iterator)local_328;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_2b8,__l_03,&local_369);
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline((string *)local_348,(string *)local_368,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_2b8,&local_e8,false);
      source_location::source_location((source_location *)local_1f8,&local_248);
      syntax_error::syntax_error(this_00,(string *)local_348,(source_location *)local_1f8);
      __cxa_throw(this_00,&syntax_error::typeinfo,syntax_error::~syntax_error);
    }
    pvVar13 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_80);
    local_298._0_4_ = uVar9 & 0xffff | uVar10 * 0x10000 + 0xff0000 & 0xff0000 | iVar11 << 0x18;
    region::region((region *)(local_298 + 8),pvVar13);
    uVar7 = local_278._8_8_;
    uVar6 = local_288._8_8_;
    uVar5 = local_288._M_allocated_capacity;
    uVar4 = local_298._0_8_;
    local_320._24_8_ = &local_2f8;
    local_328._0_4_ = local_298._0_4_;
    local_320._0_8_ = &PTR__region_001c5698;
    local_288._M_allocated_capacity = 0;
    local_288._8_8_ = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_allocated_capacity == &local_268) {
      local_2f8._8_8_ = local_268._8_8_;
      local_278._M_allocated_capacity = local_320._24_8_;
    }
    local_2f8._M_allocated_capacity._1_7_ = local_268._M_allocated_capacity._1_7_;
    local_2f8._M_local_buf[0] = local_268._M_local_buf[0];
    local_278._8_8_ = 0;
    local_268._M_local_buf[0] = '\0';
    local_2e8._M_allocated_capacity = local_258._M_allocated_capacity;
    local_2e8._8_8_ = local_258._8_8_;
    __return_storage_ptr__->is_ok_ = true;
    *(int16_t *)&__return_storage_ptr__->field_1 = local_298._0_2_;
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 2) = local_298[2];
    *(undefined1 *)((long)&__return_storage_ptr__->field_1 + 3) = local_298[3];
    (__return_storage_ptr__->field_1).fail.value._M_string_length = (size_type)&PTR__region_001c5698
    ;
    local_320._16_8_ = 0;
    (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity = uVar5;
    *(undefined8 *)((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8) = uVar6;
    local_320._8_8_ = 0;
    psVar2 = (size_type *)((long)&__return_storage_ptr__->field_1 + 0x30);
    *(size_type **)((long)&__return_storage_ptr__->field_1 + 0x20) = psVar2;
    if (local_278._M_allocated_capacity == local_320._24_8_) {
      *psVar2 = local_2f8._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x38) = local_2f8._8_8_;
    }
    else {
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) =
           local_278._M_allocated_capacity;
      *(size_type *)((long)&__return_storage_ptr__->field_1 + 0x30) =
           local_2f8._M_allocated_capacity;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = uVar7;
    local_320._32_8_ = 0;
    local_2f8._M_allocated_capacity = (ulong)(uint7)local_268._M_allocated_capacity._1_7_ << 8;
    *(size_type *)((long)&__return_storage_ptr__->field_1 + 0x40) = local_258._M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x48) = local_258._8_8_;
    local_298._0_8_ = uVar4;
    local_278._M_allocated_capacity = (size_type)&local_268;
    region::~region((region *)local_320);
    region::~region((region *)(local_298 + 8));
    if (local_1a8[0] == true) {
      region::~region((region *)(local_1a8 + 8));
    }
    if (local_138._0_1_ == true) {
      region::~region((region *)local_130);
    }
    if (local_d0[0] == true) {
      region::~region(&local_c8);
    }
    location::~location(&local_248);
  }
  else {
    location::reset((location *)this,rollback);
    local_298._0_8_ = &local_288;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,"toml::parse_local_date: ","");
    source_location::source_location((source_location *)local_d0,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[35],_true>
              ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_328,(source_location *)local_d0,
               (char (*) [35])"the next token is not a local_date");
    __l._M_len = 1;
    __l._M_array = (iterator)local_328;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_1f8,__l,(allocator_type *)local_348);
    local_248.super_region_base._vptr_region_base = (_func_int **)0x0;
    local_248.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_248.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    format_underline((string *)local_1a8,(string *)local_298,
                     (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_1f8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_248,false);
    uVar4 = local_1a8._8_8_;
    local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_130 + 8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ == local_198) {
      local_130._16_8_ = local_198[0]._8_8_;
      local_1a8._0_8_ = local_138;
    }
    local_130._9_7_ = local_198[0]._M_allocated_capacity._1_7_;
    local_130[8] = local_198[0]._M_local_buf[0];
    local_1a8._8_8_ = (_func_int **)0x0;
    local_198[0]._M_local_buf[0] = '\0';
    __return_storage_ptr__->is_ok_ = false;
    paVar1 = &(__return_storage_ptr__->field_1).fail.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._0_8_ == local_138) {
      paVar1->_M_allocated_capacity = local_130._8_8_;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      ((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8))->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._16_8_;
    }
    else {
      (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p = (pointer)local_1a8._0_8_;
      (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity = local_130._8_8_;
    }
    (__return_storage_ptr__->field_1).fail.value._M_string_length = uVar4;
    local_130._0_8_ = (_func_int **)0x0;
    local_130._8_8_ = (ulong)(uint7)local_198[0]._1_7_ << 8;
    local_1a8._0_8_ = local_198;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_248);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_p != &local_2c8) {
      operator_delete(local_2d8._M_p,local_2c8._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)local_328);
    source_location::~source_location((source_location *)local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._0_8_ != &local_288) {
      operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
    }
  }
  if (local_80.is_ok_ == true) {
    region::~region(&local_80.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<local_date, region>, std::string>
parse_local_date(location& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_local_date::invoke(loc))
    {
        location inner_loc(loc.name(), token.unwrap().str());

        const auto y = lex_date_fullyear::invoke(inner_loc);
        if(!y || inner_loc.iter() == inner_loc.end() || *inner_loc.iter() != '-')
        {
            throw internal_error(format_underline(
                "toml::parse_local_date: invalid year format",
                {{source_location(inner_loc), "should be `-`"}}),
                source_location(inner_loc));
        }
        inner_loc.advance();
        const auto m = lex_date_month::invoke(inner_loc);
        if(!m || inner_loc.iter() == inner_loc.end() || *inner_loc.iter() != '-')
        {
            throw internal_error(format_underline(
                "toml::parse_local_date: invalid month format",
                {{source_location(inner_loc), "should be `-`"}}),
                source_location(inner_loc));
        }
        inner_loc.advance();
        const auto d = lex_date_mday::invoke(inner_loc);
        if(!d)
        {
            throw internal_error(format_underline(
                "toml::parse_local_date: invalid day format",
                {{source_location(inner_loc), "here"}}),
                source_location(inner_loc));
        }

        const auto year  = static_cast<std::int16_t>(from_string<int>(y.unwrap().str(), 0));
        const auto month = static_cast<std::int8_t >(from_string<int>(m.unwrap().str(), 0));
        const auto day   = static_cast<std::int8_t >(from_string<int>(d.unwrap().str(), 0));

        // We briefly check whether the input date is valid or not. But here, we
        // only check if the RFC3339 compliance.
        //     Actually there are several special date that does not exist,
        // because of historical reasons, such as 1582/10/5-1582/10/14 (only in
        // several countries). But here, we do not care about such a complicated
        // rule. It makes the code complicated and there is only low probability
        // that such a specific date is needed in practice. If someone need to
        // validate date accurately, that means that the one need a specialized
        // library for their purpose in a different layer.
        {
            const bool is_leap = (year % 4 == 0) && ((year % 100 != 0) || (year % 400 == 0));
            const auto max_day = (month == 2) ? (is_leap ? 29 : 28) :
                ((month == 4 || month == 6 || month == 9 || month == 11) ? 30 : 31);

            if((month < 1 || 12 < month) || (day < 1 || max_day < day))
            {
                throw syntax_error(format_underline("toml::parse_date: "
                    "invalid date: it does not conform RFC3339.", {{
                    source_location(loc), "month should be 01-12, day should be"
                    " 01-28,29,30,31, depending on month/year."
                    }}), source_location(inner_loc));
            }
        }
        return ok(std::make_pair(local_date(year, static_cast<month_t>(month - 1), day),
                                 token.unwrap()));
    }
    else
    {
        loc.reset(first);
        return err(format_underline("toml::parse_local_date: ",
            {{source_location(loc), "the next token is not a local_date"}}));
    }
}